

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O2

void smf_track_add_event(smf_track_t *track,smf_event_t *event)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  smf_event_t *psVar4;
  smf_event_t *psVar5;
  int iVar6;
  
  if (track->smf == (smf_t *)0x0) {
    __assert_fail("track->smf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1b8,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  if (event->track != (smf_track_t *)0x0) {
    __assert_fail("event->track == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1b9,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  if (event->delta_time_pulses != -1) {
    __assert_fail("event->delta_time_pulses == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1ba,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  iVar3 = event->time_pulses;
  if (iVar3 < 0) {
    __assert_fail("event->time_pulses >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1bb,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  if (event->time_seconds < 0.0) {
    __assert_fail("event->time_seconds >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1bc,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  psVar4 = smf_track_get_last_event(track);
  if (((psVar4 != (smf_event_t *)0x0) && (iVar2 = smf_event_is_eot(psVar4), iVar2 != 0)) &&
     (psVar4->time_pulses <= iVar3)) {
    smf_event_remove_from_track(psVar4);
  }
  event->track = track;
  event->track_number = track->track_number;
  iVar3 = track->number_of_events;
  if (iVar3 == 0) {
    if (track->next_event_number != -1) {
      __assert_fail("track->next_event_number == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x1c4,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
    }
    track->next_event_number = 1;
    iVar3 = 0;
  }
  else if (0 < iVar3) {
    psVar4 = smf_track_get_last_event(track);
    iVar2 = psVar4->time_pulses;
    iVar3 = track->number_of_events;
    goto LAB_0010b5e4;
  }
  iVar2 = 0;
LAB_0010b5e4:
  track->number_of_events = iVar3 + 1;
  iVar3 = event->time_pulses - iVar2;
  if (event->time_pulses < iVar2) {
    g_ptr_array_add(track->events_array,event);
    g_ptr_array_sort(track->events_array,events_array_compare_function);
    iVar3 = 0;
    while( true ) {
      iVar2 = iVar3;
      iVar3 = iVar2 + 1;
      if (track->number_of_events < iVar3) break;
      psVar4 = smf_track_get_event_by_number(track,iVar3);
      psVar4->event_number = iVar3;
      if (psVar4->delta_time_pulses == -1) {
        iVar6 = psVar4->time_pulses;
        if (iVar2 == 0) {
          psVar4->delta_time_pulses = iVar6;
        }
        else {
          psVar5 = smf_track_get_event_by_number(track,iVar2);
          iVar6 = iVar6 - psVar5->time_pulses;
          psVar4->delta_time_pulses = iVar6;
          if (iVar6 < 0) {
            __assert_fail("tmp->delta_time_pulses >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                          ,0x1e7,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
          }
        }
      }
    }
    if (event->event_number < track->number_of_events) {
      psVar4 = smf_track_get_event_by_number(track,event->event_number + 1);
      if (psVar4 == (smf_event_t *)0x0) {
        __assert_fail("next_event",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x1ee,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
      }
      if (psVar4->time_pulses < event->time_pulses) {
        __assert_fail("next_event->time_pulses >= event->time_pulses",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x1ef,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
      }
      piVar1 = &psVar4->delta_time_pulses;
      *piVar1 = *piVar1 - event->delta_time_pulses;
      if (*piVar1 < 0) {
        __assert_fail("next_event->delta_time_pulses >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x1f1,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
      }
    }
  }
  else {
    event->delta_time_pulses = iVar3;
    if (iVar3 < 0) {
      __assert_fail("event->delta_time_pulses >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x1d0,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
    }
    g_ptr_array_add(track->events_array,event);
    event->event_number = track->number_of_events;
  }
  iVar3 = smf_event_is_tempo_change_or_time_signature(event);
  if (iVar3 == 0) {
    return;
  }
  iVar3 = smf_event_is_last(event);
  if (iVar3 == 0) {
    smf_create_tempo_map_and_compute_seconds(event->track->smf);
    return;
  }
  maybe_add_to_tempo_map(event);
  return;
}

Assistant:

void
smf_track_add_event(smf_track_t *track, smf_event_t *event)
{
	int i, last_pulses = 0;

	assert(track->smf != NULL);
	assert(event->track == NULL);
	assert(event->delta_time_pulses == -1);
	assert(event->time_pulses >= 0);
	assert(event->time_seconds >= 0.0);

	remove_eot_if_before_pulses(track, event->time_pulses);

	event->track = track;
	event->track_number = track->track_number;

	if (track->number_of_events == 0) {
		assert(track->next_event_number == -1);
		track->next_event_number = 1;
	}

	if (track->number_of_events > 0)
		last_pulses = smf_track_get_last_event(track)->time_pulses;

	track->number_of_events++;

	/* Are we just appending element at the end of the track? */
	if (last_pulses <= event->time_pulses) {
		event->delta_time_pulses = event->time_pulses - last_pulses;
		assert(event->delta_time_pulses >= 0);
		g_ptr_array_add(track->events_array, event);
		event->event_number = track->number_of_events;

	/* We need to insert in the middle of the track.  XXX: This is slow. */
	} else {
		/* Append, then sort according to ->time_pulses. */
		g_ptr_array_add(track->events_array, event);
		g_ptr_array_sort(track->events_array, events_array_compare_function);

		/* Renumber entries and fix their ->delta_pulses. */
		for (i = 1; i <= track->number_of_events; i++) {
			smf_event_t *tmp = smf_track_get_event_by_number(track, i);
			tmp->event_number = i;

			if (tmp->delta_time_pulses != -1)
				continue;

			if (i == 1) {
				tmp->delta_time_pulses = tmp->time_pulses;
			} else {
				tmp->delta_time_pulses = tmp->time_pulses -
					smf_track_get_event_by_number(track, i - 1)->time_pulses;
				assert(tmp->delta_time_pulses >= 0);
			}
		}

		/* Adjust ->delta_time_pulses of the next event. */
		if (event->event_number < track->number_of_events) {
			smf_event_t *next_event = smf_track_get_event_by_number(track, event->event_number + 1);
			assert(next_event);
			assert(next_event->time_pulses >= event->time_pulses);
			next_event->delta_time_pulses -= event->delta_time_pulses;
			assert(next_event->delta_time_pulses >= 0);
		}
	}

	if (smf_event_is_tempo_change_or_time_signature(event)) {
		if (smf_event_is_last(event))
			maybe_add_to_tempo_map(event);
		else
			smf_create_tempo_map_and_compute_seconds(event->track->smf);
	}
}